

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.h
# Opt level: O0

void absl::lts_20250127::strings_internal::Base64EscapeInternal<std::__cxx11::string>
               (uchar *src,size_t szsrc,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dest,
               bool do_padding,char *base64_chars)

{
  size_t new_size;
  char *dest_00;
  size_t sVar1;
  size_t escaped_len;
  size_t calc_escaped_size;
  char *base64_chars_local;
  bool do_padding_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dest_local;
  size_t szsrc_local;
  uchar *src_local;
  
  new_size = CalculateBase64EscapedLenInternal(szsrc,do_padding);
  STLStringResizeUninitialized<std::__cxx11::string,void>(dest,new_size);
  dest_00 = (char *)std::__cxx11::string::operator[]((ulong)dest);
  sVar1 = std::__cxx11::string::size();
  sVar1 = Base64EscapeInternal(src,szsrc,dest_00,sVar1,base64_chars,do_padding);
  if (new_size == sVar1) {
    std::__cxx11::string::erase((ulong)dest,sVar1);
    return;
  }
  __assert_fail("calc_escaped_size == escaped_len",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/escaping.h"
                ,0x31,
                "void absl::strings_internal::Base64EscapeInternal(const unsigned char *, size_t, String *, bool, const char *) [String = std::basic_string<char>]"
               );
}

Assistant:

void Base64EscapeInternal(const unsigned char* src, size_t szsrc, String* dest,
                          bool do_padding, const char* base64_chars) {
  const size_t calc_escaped_size =
      CalculateBase64EscapedLenInternal(szsrc, do_padding);
  STLStringResizeUninitialized(dest, calc_escaped_size);

  const size_t escaped_len = Base64EscapeInternal(
      src, szsrc, &(*dest)[0], dest->size(), base64_chars, do_padding);
  assert(calc_escaped_size == escaped_len);
  dest->erase(escaped_len);
}